

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_EditionDefaultsInvalidCompile_Test::
CommandLineInterfaceTest_EditionDefaultsInvalidCompile_Test
          (CommandLineInterfaceTest_EditionDefaultsInvalidCompile_Test *this)

{
  CommandLineInterfaceTest_EditionDefaultsInvalidCompile_Test *this_local;
  
  CommandLineInterfaceTest::CommandLineInterfaceTest(&this->super_CommandLineInterfaceTest);
  (this->super_CommandLineInterfaceTest).super_CommandLineInterfaceTester.super_Test._vptr_Test =
       (_func_int **)&PTR__CommandLineInterfaceTest_EditionDefaultsInvalidCompile_Test_029fb628;
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, EditionDefaultsInvalidCompile) {
  CreateTempFile("google/protobuf/descriptor.proto",
                 google::protobuf::DescriptorProto::descriptor()->file()->DebugString());
  Run("protocol_compiler --proto_path=$tmpdir "
      "--encode=pb.CppFeatures "
      "--edition_defaults_out=$tmpdir/defaults "
      "google/protobuf/descriptor.proto");
  ExpectErrorSubstring("Cannot use --encode or --decode and generate defaults");
}